

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

bool lest::search(text *part,text *line)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  
  _Var1._M_current = (line->_M_dataplus)._M_p;
  __first2._M_current = (part->_M_dataplus)._M_p;
  _Var1 = std::
          __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(char,char)>>
                    (_Var1,_Var1._M_current + line->_M_string_length,__first2,
                     __first2._M_current + part->_M_string_length,
                     (_Iter_comp_iter<bool_(*)(char,_char)>)0x109622);
  return _Var1._M_current != (line->_M_dataplus)._M_p + line->_M_string_length;
}

Assistant:

inline bool search( text part, text line )
    {
        return std::search(
            line.begin(), line.end(),
            part.begin(), part.end(), case_insensitive_equal ) != line.end();
    }